

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

void ZSTD_CCtx_trace(ZSTD_CCtx *cctx,size_t extraCSize)

{
  uint uVar1;
  ZSTD_Trace trace;
  undefined4 local_48;
  uint uStack_44;
  ulong uStack_40;
  size_t local_38;
  unsigned_long_long uStack_30;
  long local_28;
  ZSTD_CCtx_params *pZStack_20;
  ZSTD_CCtx *local_18;
  undefined8 uStack_10;
  
  if (cctx->traceCtx != 0) {
    uVar1 = 1;
    if ((cctx->inBuffSize == 0) && (cctx->outBuffSize == 0)) {
      uVar1 = (uint)(0 < (cctx->appliedParams).nbWorkers);
    }
    uStack_10 = 0;
    _local_48 = CONCAT44(uVar1,0x2909);
    uStack_40 = (ulong)cctx->dictID;
    local_38 = cctx->dictContentSize;
    uStack_30 = cctx->consumedSrcSize;
    local_28 = extraCSize + cctx->producedCSize;
    pZStack_20 = &cctx->appliedParams;
    local_18 = cctx;
    ZSTD_trace_compress_end(cctx->traceCtx,&local_48);
  }
  cctx->traceCtx = 0;
  return;
}

Assistant:

void ZSTD_CCtx_trace(ZSTD_CCtx* cctx, size_t extraCSize)
{
#if ZSTD_TRACE
    if (cctx->traceCtx && ZSTD_trace_compress_end != NULL) {
        int const streaming = cctx->inBuffSize > 0 || cctx->outBuffSize > 0 || cctx->appliedParams.nbWorkers > 0;
        ZSTD_Trace trace;
        ZSTD_memset(&trace, 0, sizeof(trace));
        trace.version = ZSTD_VERSION_NUMBER;
        trace.streaming = streaming;
        trace.dictionaryID = cctx->dictID;
        trace.dictionarySize = cctx->dictContentSize;
        trace.uncompressedSize = cctx->consumedSrcSize;
        trace.compressedSize = cctx->producedCSize + extraCSize;
        trace.params = &cctx->appliedParams;
        trace.cctx = cctx;
        ZSTD_trace_compress_end(cctx->traceCtx, &trace);
    }
    cctx->traceCtx = 0;
#else
    (void)cctx;
    (void)extraCSize;
#endif
}